

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

int nni_sock_shutdown(nni_sock *sock)

{
  nni_mtx *mtx;
  nni_list *list;
  void *item;
  int iVar1;
  nni_listener *l;
  nni_dialer *d;
  nni_pipe *p;
  void *pvVar2;
  nni_list *list_00;
  
  mtx = &sock->s_mx;
  nni_mtx_lock(mtx);
  if (sock->s_closing == true) {
    nni_mtx_unlock(mtx);
    iVar1 = 7;
  }
  else {
    sock->s_closing = true;
    l = (nni_listener *)nni_list_first(&sock->s_listeners);
    while (l != (nni_listener *)0x0) {
      nni_listener_hold(l);
      nni_mtx_unlock(mtx);
      nni_listener_close(l);
      nni_mtx_lock(mtx);
      l = (nni_listener *)nni_list_first(&sock->s_listeners);
    }
    d = (nni_dialer *)nni_list_first(&sock->s_dialers);
    while (d != (nni_dialer *)0x0) {
      nni_dialer_hold(d);
      nni_mtx_unlock(mtx);
      nni_dialer_close(d);
      nni_mtx_lock(mtx);
      d = (nni_dialer *)nni_list_first(&sock->s_dialers);
    }
    list = &sock->s_pipes;
    for (p = (nni_pipe *)nni_list_first(list); p != (nni_pipe *)0x0;
        p = (nni_pipe *)nni_list_next(list,p)) {
      nni_pipe_close(p);
    }
    nni_mtx_unlock(mtx);
    nni_msgq_close(sock->s_urq);
    nni_msgq_close(sock->s_uwq);
    nni_mtx_lock(&sock_lk);
    list_00 = &sock->s_ctxs;
    pvVar2 = nni_list_first(list_00);
    while (item = pvVar2, item != (void *)0x0) {
      pvVar2 = nni_list_next(list_00,item);
      *(undefined1 *)((long)item + 0x58) = 1;
      if (*(int *)((long)item + 0x5c) == 0) {
        nni_id_remove(&ctx_ids,(ulong)*(uint *)((long)item + 0x60));
        nni_list_remove(list_00,item);
        if (*(long *)((long)item + 0x48) != 0) {
          (**(code **)((long)item + 0x28))();
        }
        nni_free(item,*(size_t *)((long)item + 0x50));
      }
    }
    iVar1 = nni_list_empty(list_00);
    if (iVar1 == 0) {
      do {
        nni_cv_wait(&sock->s_close_cv);
        iVar1 = nni_list_empty(list_00);
      } while (iVar1 == 0);
    }
    nni_mtx_unlock(&sock_lk);
    nni_mtx_lock(mtx);
    iVar1 = nni_list_empty(list);
    if (iVar1 == 0) {
      do {
        nni_cv_wait(&sock->s_cv);
        iVar1 = nni_list_empty(list);
      } while (iVar1 == 0);
    }
    pvVar2 = nni_list_first(list);
    if (pvVar2 != (void *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x2b6,"nni_list_first(&sock->s_pipes) == NULL");
    }
    nni_mtx_unlock(mtx);
    (*(sock->s_sock_ops).sock_close)(sock->s_data);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_sock_shutdown(nni_sock *sock)
{
	nni_pipe     *pipe;
	nni_dialer   *d;
	nni_listener *l;
	nni_ctx      *ctx;
	nni_ctx      *nctx;

	nni_mtx_lock(&sock->s_mx);
	if (sock->s_closing) {
		nni_mtx_unlock(&sock->s_mx);
		return (NNG_ECLOSED);
	}
	// Mark us closing, so no more EPs or changes can occur.
	sock->s_closing = true;

	while ((l = nni_list_first(&sock->s_listeners)) != NULL) {
		nni_listener_hold(l);
		nni_mtx_unlock(&sock->s_mx);
		nni_listener_close(l);
		nni_mtx_lock(&sock->s_mx);
	}

	while ((d = nni_list_first(&sock->s_dialers)) != NULL) {
		nni_dialer_hold(d);
		nni_mtx_unlock(&sock->s_mx);
		nni_dialer_close(d);
		nni_mtx_lock(&sock->s_mx);
	}

	// For each pipe, arrange for it to teardown hard.  We would
	// expect there not to be any here.
	NNI_LIST_FOREACH (&sock->s_pipes, pipe) {
		nni_pipe_close(pipe);
	}

	nni_mtx_unlock(&sock->s_mx);

	// Close the upper queues immediately.
	nni_msgq_close(sock->s_urq);
	nni_msgq_close(sock->s_uwq);

	// We now mark any owned contexts as closing.
	// XXX: Add context draining support here!
	nni_mtx_lock(&sock_lk);
	nctx = nni_list_first(&sock->s_ctxs);
	while ((ctx = nctx) != NULL) {
		nctx          = nni_list_next(&sock->s_ctxs, ctx);
		ctx->c_closed = true;
		if (ctx->c_ref == 0) {
			// No open operations.  So close it.
			nni_id_remove(&ctx_ids, ctx->c_id);
			nni_list_remove(&sock->s_ctxs, ctx);
			nni_ctx_destroy(ctx);
		}
		// If still has a reference count, then wait for last
		// reference to close before nuking it.
	}

	// Generally, unless the protocol is blocked trying to perform
	// writes (e.g. a slow reader on the other side), it should be
	// trying to shut things down.  We wait to give it
	// a chance to do so gracefully.

	while (!nni_list_empty(&sock->s_ctxs)) {
		nni_cv_wait(&sock->s_close_cv);
	}
	nni_mtx_unlock(&sock_lk);

	nni_mtx_lock(&sock->s_mx);
	// We have to wait for pipes to be removed.
	while (!nni_list_empty(&sock->s_pipes)) {
		nni_cv_wait(&sock->s_cv);
	}
	NNI_ASSERT(nni_list_first(&sock->s_pipes) == NULL);
	nni_mtx_unlock(&sock->s_mx);

	sock->s_sock_ops.sock_close(sock->s_data);

	// At this point, there are no threads blocked inside of us
	// that are referencing socket state.  User code should call
	// nng_socket_close to release the last resources.
	return (0);
}